

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  uint32_t uVar2;
  FILE *local_30;
  FILE *local_28;
  int cabac_zero_word;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  read_debug_rbsp_trailing_bits(b);
  if (h->pps->entropy_coding_mode_flag != 0) {
    while (iVar1 = more_rbsp_trailing_data(h,b), iVar1 != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_28 = _stdout;
      }
      else {
        local_28 = (FILE *)h264_dbgfile;
      }
      fprintf(local_28,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar2 = bs_read_u(b,0x10);
      if (h264_dbgfile == (FILE *)0x0) {
        local_30 = _stdout;
      }
      else {
        local_30 = (FILE *)h264_dbgfile;
      }
      fprintf(local_30,"cabac_zero_word: %d \n",(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void read_debug_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    read_debug_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); int cabac_zero_word = bs_read_u(b, 16); printf("cabac_zero_word: %d \n", cabac_zero_word); 
        }
    }
}